

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

RPCHelpMan * wallet::settxfee(void)

{
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  _Manager_type in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffb48;
  pointer in_stack_fffffffffffffb58;
  pointer pRVar1;
  pointer in_stack_fffffffffffffb60;
  pointer pRVar2;
  pointer in_stack_fffffffffffffb68;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb88 [16];
  pointer in_stack_fffffffffffffb98;
  pointer in_stack_fffffffffffffba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbb8 [16];
  undefined1 in_stack_fffffffffffffbc8 [56];
  string local_3e8;
  string local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  char *local_368;
  size_type local_360;
  char local_358 [8];
  undefined8 uStack_350;
  string local_348 [32];
  string local_328 [32];
  RPCResult local_308;
  RPCArgOptions local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  undefined1 local_1a0;
  string local_198 [32];
  RPCArg local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"settxfee",(allocator<char> *)&stack0xfffffffffffffbb7);
  std::operator+(&local_70,"\nSet the transaction fee rate in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_50,&local_70,
                 "/kvB for this wallet. Overrides the global -paytxfee command line parameter.\nCan be deactivated by passing 0 as the fee. In that case automatic fee selection will be used by default.\n"
                );
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"amount",(allocator<char> *)&stack0xfffffffffffffb97);
  local_1f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a0 = 0;
  std::operator+(&local_238,"The transaction fee rate in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_218,&local_238,"/kvB");
  local_280.oneline_description._M_dataplus._M_p = (pointer)&local_280.oneline_description.field_2;
  local_280.skip_type_check = false;
  local_280.oneline_description._M_string_length = 0;
  local_280.oneline_description.field_2._M_local_buf[0] = '\0';
  local_280.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_280.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_280.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_280.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_280._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffffb20;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffb28;
  name.field_2._8_8_ = in_stack_fffffffffffffb30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffb40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffb38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffffb48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffb58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffb60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffb68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffb70._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffb70._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffb70._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffb88;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffba0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb98;
  description_01.field_2 = in_stack_fffffffffffffba8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffbc8._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffbc8._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffbc8._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffffbc8[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffffbc8[0x31];
  opts._66_6_ = in_stack_fffffffffffffbc8._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffffbb8[0];
  opts._1_7_ = in_stack_fffffffffffffbb8._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbb8._8_8_;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb98,__l,
             (allocator_type *)&stack0xfffffffffffffb96);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"",(allocator<char> *)&stack0xfffffffffffffb77);
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"Returns true if successful",(allocator<char> *)&stack0xfffffffffffffb76);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffb20;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb28;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffb30;
  description._M_string_length = in_stack_fffffffffffffb40;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb38;
  description.field_2 = in_stack_fffffffffffffb48;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_308,BOOL,m_key_name,description,inner,SUB81(local_328,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb20;
  result._0_8_ = in_stack_fffffffffffffb18;
  result.m_key_name._M_string_length = in_stack_fffffffffffffb28;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb30;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffb38;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb40;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffb48;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffb70;
  result.m_cond._8_16_ = in_stack_fffffffffffffb88;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffb98;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffb78,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"settxfee",(allocator<char> *)&stack0xfffffffffffffb57);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"0.00001",(allocator<char> *)&stack0xfffffffffffffb56);
  HelpExampleCli(&local_3a8,&local_3c8,&local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"settxfee",
             (allocator<char> *)&stack0xfffffffffffffb55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbb8,"0.00001",
             (allocator<char> *)&stack0xfffffffffffffb54);
  HelpExampleRpc((string *)&stack0xfffffffffffffbf8,(string *)&stack0xfffffffffffffbd8,
                 (string *)&stack0xfffffffffffffbb8);
  std::operator+(&local_388,&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbf8);
  local_368 = local_358;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == &local_388.field_2) {
    uStack_350 = local_388.field_2._8_8_;
  }
  else {
    local_368 = local_388._M_dataplus._M_p;
  }
  local_360 = local_388._M_string_length;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:433:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp:433:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffb48;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb98;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb88._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffb88._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffba0;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffbb8._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffbb8._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffba8._M_local_buf;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffb20,&stack0xfffffffffffffb28)),
             description_00,args,(RPCResults)in_stack_fffffffffffffb70,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffb28);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb78);
  RPCResult::~RPCResult(&local_308);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb58);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_328);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb98);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_280);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1f8._M_first);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan settxfee()
{
    return RPCHelpMan{"settxfee",
                "\nSet the transaction fee rate in " + CURRENCY_UNIT + "/kvB for this wallet. Overrides the global -paytxfee command line parameter.\n"
                "Can be deactivated by passing 0 as the fee. In that case automatic fee selection will be used by default.\n",
                {
                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "The transaction fee rate in " + CURRENCY_UNIT + "/kvB"},
                },
                RPCResult{
                    RPCResult::Type::BOOL, "", "Returns true if successful"
                },
                RPCExamples{
                    HelpExampleCli("settxfee", "0.00001")
            + HelpExampleRpc("settxfee", "0.00001")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    CAmount nAmount = AmountFromValue(request.params[0]);
    CFeeRate tx_fee_rate(nAmount, 1000);
    CFeeRate max_tx_fee_rate(pwallet->m_default_max_tx_fee, 1000);
    if (tx_fee_rate == CFeeRate(0)) {
        // automatic selection
    } else if (tx_fee_rate < pwallet->chain().relayMinFee()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be less than min relay tx fee (%s)", pwallet->chain().relayMinFee().ToString()));
    } else if (tx_fee_rate < pwallet->m_min_fee) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be less than wallet min fee (%s)", pwallet->m_min_fee.ToString()));
    } else if (tx_fee_rate > max_tx_fee_rate) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be more than wallet max tx fee (%s)", max_tx_fee_rate.ToString()));
    }

    pwallet->m_pay_tx_fee = tx_fee_rate;
    return true;
},
    };
}